

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O2

void __thiscall Logger::~Logger(Logger *this)

{
  buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  thread *this_01;
  
  this_01 = this->l_asyncw_thread;
  if (this_01 == (thread *)0x0) goto LAB_00102d15;
  LOCK();
  (this->is_thread_stop)._M_base._M_i = true;
  UNLOCK();
  if ((this_01->_M_id)._M_thread == 0) {
LAB_00102cfd:
    std::thread::~thread(this_01);
  }
  else {
    std::condition_variable::notify_all();
    std::thread::join();
    this_01 = this->l_asyncw_thread;
    if (this_01 != (thread *)0x0) goto LAB_00102cfd;
    this_01 = (thread *)0x0;
  }
  operator_delete(this_01,8);
LAB_00102d15:
  std::mutex::lock(&this->l_mutex);
  if ((FILE *)this->l_fp != (FILE *)0x0) {
    fclose((FILE *)this->l_fp);
  }
  if (this->l_buf != (char *)0x0) {
    operator_delete__(this->l_buf);
  }
  this_00 = this->l_buffer_queue;
  if (this_00 !=
      (buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    buffer_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~buffer_queue(this_00);
    operator_delete(this_00,0x88);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->l_mutex);
  return;
}

Assistant:

Logger::~Logger()
{
    if(l_asyncw_thread)
    {
        is_thread_stop = true;
        if(l_asyncw_thread->joinable())
        {
            l_buffer_queue->notify();
            l_asyncw_thread->join();
        }
        delete l_asyncw_thread;
    }

    lock_guard<mutex> lck (l_mutex);
    if (l_fp != NULL)
    {
        fclose(l_fp);
    }

    if(l_buf)
    {
        delete [] l_buf;
    }

    if(l_buffer_queue)
    {
        delete l_buffer_queue;
    }
}